

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O0

void * FileSystem::ReadFileRawToEnd(string *file)

{
  size_t sVar1;
  void *__ptr;
  char *__filename;
  FILE *__stream;
  size_t readSize;
  FILE *fp;
  void *allocatedBuffer;
  string local_40;
  size_t local_20;
  off_t fileSize;
  string *file_local;
  
  fileSize = (off_t)file;
  std::__cxx11::string::string((string *)&local_40,(string *)file);
  sVar1 = GetFileSize(&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if ((sVar1 != 0) && (local_20 = sVar1, __ptr = malloc(sVar1), __ptr != (void *)0x0)) {
    __filename = (char *)std::__cxx11::string::c_str();
    __stream = fopen(__filename,"r");
    if (__stream != (FILE *)0x0) {
      sVar1 = fread(__ptr,1,local_20,__stream);
      fclose(__stream);
      if (sVar1 == local_20) {
        return __ptr;
      }
    }
    free(__ptr);
  }
  return (void *)0x0;
}

Assistant:

void* FileSystem::ReadFileRawToEnd(string file) {
    off_t fileSize = GetFileSize(file);

    if(fileSize == 0)
        return NULL;

    void* allocatedBuffer = malloc((size_t) fileSize);

    if(allocatedBuffer == NULL)
        return NULL;

    FILE* fp = fopen(file.c_str(), "r");

    if(fp) {
        size_t readSize = fread(allocatedBuffer, 1, (size_t) fileSize, fp);

        fclose(fp);

        if(readSize == fileSize) {
            return allocatedBuffer;
        }
    }

    free(allocatedBuffer);

    return NULL;
}